

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

string * __thiscall
higan::LogFile::GetFileName_abi_cxx11_(string *__return_storage_ptr__,LogFile *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_49;
  char local_48 [8];
  char buffer [32];
  tm *tm_now;
  time_t now;
  LogFile *this_local;
  string *result_name;
  
  now = (time_t)this;
  this_local = (LogFile *)__return_storage_ptr__;
  tm_now = (tm *)time((time_t *)0x0);
  buffer._24_8_ = localtime((time_t *)&tm_now);
  strftime(local_48,0x20,".%Y%m%d-%H%M%S.",(tm *)buffer._24_8_);
  local_49 = 0;
  std::operator+(&local_70,&this->log_dir_,"/");
  std::operator+(__return_storage_ptr__,&local_70,&this->log_prefix_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"log");
  return __return_storage_ptr__;
}

Assistant:

std::string LogFile::GetFileName()
{
	time_t now = time(nullptr);

	struct tm* tm_now = localtime(&now);

	char buffer[32];

	strftime(buffer, sizeof buffer, ".%Y%m%d-%H%M%S.", tm_now);

	std::string result_name = log_dir_ + "/" + log_prefix_;
	result_name.append(buffer);
	result_name += "log";

	return result_name;
}